

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  ushort uVar1;
  uint size;
  Node *block;
  int iVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  AuxsetnodeT asn;
  uint local_54;
  Table *local_40;
  uint local_38;
  
  size = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (size < nasize) {
    setarrayvector(L,t,nasize);
  }
  local_40 = t;
  local_38 = nhsize;
  iVar2 = luaD_rawrunprotected(L,auxsetnode,&local_40);
  if (iVar2 == 0) {
    if (nasize < size) {
      t->sizearray = nasize;
      uVar7 = (ulong)nasize;
      lVar6 = uVar7 << 4;
      uVar5 = uVar7;
      do {
        uVar5 = uVar5 + 1;
        if (*(short *)((long)&t->array->tt_ + lVar6) != 0) {
          luaH_setint(L,t,uVar5,(TValue *)((long)&t->array->value_ + lVar6));
        }
        lVar6 = lVar6 + 0x10;
      } while ((1 - (ulong)size) + uVar5 != 1);
      pTVar3 = (TValue *)luaM_realloc_(L,t->array,(ulong)size << 4,uVar7 << 4);
      t->array = pTVar3;
    }
    uVar5 = (ulong)local_54;
    if (0 < (int)local_54) {
      lVar6 = uVar5 + 1;
      pTVar3 = (TValue *)&block[uVar5 - 1].i_key;
      do {
        if (pTVar3[-1].tt_ != 0) {
          pTVar4 = luaH_set(L,t,pTVar3);
          pTVar4->value_ = pTVar3[-1].value_;
          uVar1 = pTVar3[-1].tt_;
          pTVar4->tt_ = uVar1;
          if ((short)uVar1 < 0) {
            if (((uVar1 & 0x7f) != (ushort)((pTVar4->value_).gc)->tt) ||
               ((L != (lua_State *)0x0 &&
                ((((pTVar4->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                            ,0x1c5,
                            "void luaH_resize(lua_State *, Table *, unsigned int, unsigned int)");
            }
          }
        }
        lVar6 = lVar6 + -1;
        pTVar3 = pTVar3 + -2;
      } while (1 < lVar6);
    }
    if (0 < (int)local_54) {
      luaM_realloc_(L,block,uVar5 << 5,0);
    }
    return;
  }
  setarrayvector(L,t,size);
  luaD_throw(L,4);
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int nasize,
                                          unsigned int nhsize) {
  unsigned int i;
  int j;
  AuxsetnodeT asn;
  unsigned int oldasize = t->sizearray;
  int oldhsize = allocsizenode(t);
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  asn.t = t; asn.nhsize = nhsize;
  if (luaD_rawrunprotected(L, auxsetnode, &asn) != LUA_OK) {  /* mem. error? */
    setarrayvector(L, t, oldasize);  /* array back to its original size */
    luaD_throw(L, LUA_ERRMEM);  /* rethrow memory error */
  }
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (j = oldhsize - 1; j >= 0; j--) {
    Node *old = nold + j;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (oldhsize > 0)  /* not the dummy node? */
    luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}